

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateByteSize
          (MessageGenerator *this,Printer *printer)

{
  FieldGenerator *pFVar1;
  Descriptor *pDVar2;
  int iVar3;
  ulong uVar4;
  uint __c;
  uint extraout_EDX;
  int i_00;
  FieldDescriptor *field;
  int i;
  long lVar5;
  char *pcVar6;
  FieldDescriptor *pFVar7;
  ulong uVar8;
  long lVar9;
  string local_50;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x58) == '\x01') {
    io::Printer::Print(printer,
                       "int $classname$::ByteSize() const {\n  int total_size = _extensions_.MessageSetByteSize();\n"
                       ,"classname",&this->classname_);
    if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
      io::Printer::Print(printer,
                         "  total_size += ::google::protobuf::internal::WireFormat::\n      ComputeUnknownMessageSetItemsSize(unknown_fields());\n"
                        );
    }
    io::Printer::Print(printer,
                       "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n  _cached_size_ = total_size;\n  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n  return total_size;\n}\n"
                      );
    return;
  }
  io::Printer::Print(printer,"int $classname$::ByteSize() const {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"int total_size = 0;\n\n");
  uVar4 = 0xffffffffffffffff;
  lVar5 = 0;
  uVar8 = 0;
  while( true ) {
    iVar3 = (int)uVar4;
    if ((long)*(int *)(this->descriptor_ + 0x2c) <= (long)uVar8) break;
    lVar9 = *(long *)(this->descriptor_ + 0x30);
    if (*(int *)(lVar9 + 0x30 + lVar5) != 3) {
      pFVar7 = (FieldDescriptor *)(lVar9 + lVar5);
      pcVar6 = (char *)0x8;
      uVar4 = (ulong)(uint)(iVar3 >> 0x1f) << 0x20 | uVar4 & 0xffffffff;
      __c = (uint)((long)uVar4 % 8);
      if ((iVar3 < 0) || (__c = (uint)(uVar8 >> 3) & 0x1fffffff, __c != (uint)((long)uVar4 / 8))) {
        if (-1 < iVar3) {
          io::Printer::Outdent(printer);
          pcVar6 = "}\n";
          io::Printer::Print(printer,"}\n");
          __c = extraout_EDX;
        }
        pcVar6 = FieldDescriptor::index(pFVar7,pcVar6,__c);
        SimpleItoa_abi_cxx11_(&local_50,(protobuf *)((ulong)pcVar6 & 0xffffffff),i_00);
        io::Printer::Print(printer,"if (_has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
                           "index",&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        io::Printer::Indent(printer);
      }
      anon_unknown_0::PrintFieldComment(printer,pFVar7);
      FieldName_abi_cxx11_(&local_50,(cpp *)pFVar7,field);
      io::Printer::Print(printer,"if (has_$name$()) {\n","name",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      io::Printer::Indent(printer);
      pFVar1 = FieldGeneratorMap::get(&this->field_generators_,pFVar7);
      (*pFVar1->_vptr_FieldGenerator[0x11])(pFVar1,printer);
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n\n");
      uVar4 = uVar8 & 0xffffffff;
    }
    uVar8 = uVar8 + 1;
    lVar5 = lVar5 + 0x78;
  }
  if (-1 < iVar3) {
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  lVar9 = 0;
  for (lVar5 = 0; pDVar2 = this->descriptor_, lVar5 < *(int *)(pDVar2 + 0x2c); lVar5 = lVar5 + 1) {
    if (*(int *)(*(long *)(pDVar2 + 0x30) + 0x30 + lVar9) == 3) {
      pFVar7 = (FieldDescriptor *)(*(long *)(pDVar2 + 0x30) + lVar9);
      anon_unknown_0::PrintFieldComment(printer,pFVar7);
      pFVar1 = FieldGeneratorMap::get(&this->field_generators_,pFVar7);
      (*pFVar1->_vptr_FieldGenerator[0x11])(pFVar1,printer);
      io::Printer::Print(printer,"\n");
    }
    lVar9 = lVar9 + 0x78;
  }
  if (0 < *(int *)(pDVar2 + 0x58)) {
    io::Printer::Print(printer,"total_size += _extensions_.ByteSize();\n\n");
    pDVar2 = this->descriptor_;
  }
  if (*(int *)(*(long *)(*(long *)(pDVar2 + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,"if (!unknown_fields().empty()) {\n");
    io::Printer::Indent(printer);
    io::Printer::Print(printer,
                       "total_size +=\n  ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(\n    unknown_fields());\n"
                      );
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  io::Printer::Print(printer,
                     "GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n_cached_size_ = total_size;\nGOOGLE_SAFE_CONCURRENT_WRITES_END();\nreturn total_size;\n"
                    );
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateByteSize(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "int $classname$::ByteSize() const {\n"
      "  int total_size = _extensions_.MessageSetByteSize();\n",
      "classname", classname_);
    if (HasUnknownFields(descriptor_->file())) {
      printer->Print(
        "  total_size += ::google::protobuf::internal::WireFormat::\n"
        "      ComputeUnknownMessageSetItemsSize(unknown_fields());\n");
    }
    printer->Print(
      "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
      "  _cached_size_ = total_size;\n"
      "  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
      "  return total_size;\n"
      "}\n");
    return;
  }

  printer->Print(
    "int $classname$::ByteSize() const {\n",
    "classname", classname_);
  printer->Indent();
  printer->Print(
    "int total_size = 0;\n"
    "\n");

  int last_index = -1;

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated()) {
      // See above in GenerateClear for an explanation of this.
      // TODO(kenton):  Share code?  Unclear how to do so without
      //   over-engineering.
      if ((i / 8) != (last_index / 8) ||
          last_index < 0) {
        if (last_index >= 0) {
          printer->Outdent();
          printer->Print("}\n");
        }
        printer->Print(
          "if (_has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
          "index", SimpleItoa(field->index()));
        printer->Indent();
      }
      last_index = i;

      PrintFieldComment(printer, field);

      printer->Print(
        "if (has_$name$()) {\n",
        "name", FieldName(field));
      printer->Indent();

      field_generators_.get(field).GenerateByteSize(printer);

      printer->Outdent();
      printer->Print(
        "}\n"
        "\n");
    }
  }

  if (last_index >= 0) {
    printer->Outdent();
    printer->Print("}\n");
  }

  // Repeated fields don't use _has_bits_ so we count them in a separate
  // pass.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (field->is_repeated()) {
      PrintFieldComment(printer, field);
      field_generators_.get(field).GenerateByteSize(printer);
      printer->Print("\n");
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "total_size += _extensions_.ByteSize();\n"
      "\n");
  }

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print("if (!unknown_fields().empty()) {\n");
    printer->Indent();
    printer->Print(
      "total_size +=\n"
      "  ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(\n"
      "    unknown_fields());\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  // We update _cached_size_ even though this is a const method.  In theory,
  // this is not thread-compatible, because concurrent writes have undefined
  // results.  In practice, since any concurrent writes will be writing the
  // exact same value, it works on all common processors.  In a future version
  // of C++, _cached_size_ should be made into an atomic<int>.
  printer->Print(
    "GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
    "_cached_size_ = total_size;\n"
    "GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
    "return total_size;\n");

  printer->Outdent();
  printer->Print("}\n");
}